

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O1

int next_code(archive_read_filter *self)

{
  undefined1 uVar1;
  void *pvVar2;
  undefined1 *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  while( true ) {
    pvVar2 = self->data;
    uVar4 = getbits(self,*(int *)((long)pvVar2 + 0x4c));
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    next_code::debug_index = next_code::debug_index + 1;
    if (0x3ff < next_code::debug_index) {
      next_code::debug_index = 0;
    }
    if ((uVar4 != 0x100) || (*(int *)((long)pvVar2 + 0x38) == 0)) break;
    iVar8 = *(int *)((long)pvVar2 + 0x4c);
    *(undefined4 *)((long)pvVar2 + 0x1c) = 0;
    iVar8 = (iVar8 - (int)(*(ulong *)((long)pvVar2 + 0x20) % (ulong)(long)iVar8)) % iVar8 + 1;
    while (iVar8 = iVar8 + -1, 0 < iVar8) {
      iVar5 = getbits(self,8);
      if (iVar5 < 0) {
        return iVar5;
      }
    }
    *(undefined8 *)((long)pvVar2 + 0x20) = 0;
    *(undefined8 *)((long)pvVar2 + 0x48) = 0x9000001ff;
    *(undefined4 *)((long)pvVar2 + 0x58) = 0x101;
    *(undefined4 *)((long)pvVar2 + 0x50) = 0xffffffff;
  }
  uVar7 = *(uint *)((long)pvVar2 + 0x58);
  if (((int)uVar4 <= (int)uVar7) && ((uVar4 != uVar7 || (-1 < *(int *)((long)pvVar2 + 0x50))))) {
    uVar6 = uVar4;
    if ((int)uVar7 <= (int)uVar4) {
      puVar3 = *(undefined1 **)((long)pvVar2 + 0x30060);
      *(undefined1 **)((long)pvVar2 + 0x30060) = puVar3 + 1;
      *puVar3 = *(undefined1 *)((long)pvVar2 + 0x54);
      uVar6 = *(uint *)((long)pvVar2 + 0x50);
    }
    if (0xff < (int)uVar6) {
      do {
        uVar1 = *(undefined1 *)((long)pvVar2 + (ulong)uVar6 + 0x5c);
        puVar3 = *(undefined1 **)((long)pvVar2 + 0x30060);
        *(undefined1 **)((long)pvVar2 + 0x30060) = puVar3 + 1;
        *puVar3 = uVar1;
        uVar6 = (uint)*(ushort *)((long)pvVar2 + (ulong)uVar6 * 2 + 0x1005c);
      } while (0xff < uVar6);
    }
    *(uint *)((long)pvVar2 + 0x54) = uVar6;
    puVar3 = *(undefined1 **)((long)pvVar2 + 0x30060);
    *(undefined1 **)((long)pvVar2 + 0x30060) = puVar3 + 1;
    *puVar3 = (char)uVar6;
    iVar8 = *(int *)((long)pvVar2 + 0x58);
    if ((iVar8 < *(int *)((long)pvVar2 + 0x40)) && (-1 < *(int *)((long)pvVar2 + 0x50))) {
      *(short *)((long)pvVar2 + (long)iVar8 * 2 + 0x1005c) = (short)*(int *)((long)pvVar2 + 0x50);
      *(undefined1 *)((long)pvVar2 + (long)iVar8 + 0x5c) = *(undefined1 *)((long)pvVar2 + 0x54);
      *(int *)((long)pvVar2 + 0x58) = *(int *)((long)pvVar2 + 0x58) + 1;
    }
    if (*(int *)((long)pvVar2 + 0x48) < *(int *)((long)pvVar2 + 0x58)) {
      iVar8 = *(int *)((long)pvVar2 + 0x4c) + 1;
      *(int *)((long)pvVar2 + 0x4c) = iVar8;
      *(undefined8 *)((long)pvVar2 + 0x20) = 0;
      if (iVar8 == *(int *)((long)pvVar2 + 0x44)) {
        uVar7 = *(uint *)((long)pvVar2 + 0x40);
      }
      else {
        uVar7 = ~(-1 << ((byte)iVar8 & 0x1f));
      }
      *(uint *)((long)pvVar2 + 0x48) = uVar7;
    }
    *(uint *)((long)pvVar2 + 0x50) = uVar4;
    return 0;
  }
  archive_set_error(&self->archive->archive,-1,"Invalid compressed data");
  return -0x1e;
}

Assistant:

static int
next_code(struct archive_read_filter *self)
{
	struct private_data *state = (struct private_data *)self->data;
	int code, newcode;

	static int debug_buff[1024];
	static unsigned debug_index;

	code = newcode = getbits(self, state->bits);
	if (code < 0)
		return (code);

	debug_buff[debug_index++] = code;
	if (debug_index >= sizeof(debug_buff)/sizeof(debug_buff[0]))
		debug_index = 0;

	/* If it's a reset code, reset the dictionary. */
	if ((code == 256) && state->use_reset_code) {
		/*
		 * The original 'compress' implementation blocked its
		 * I/O in a manner that resulted in junk bytes being
		 * inserted after every reset.  The next section skips
		 * this junk.  (Yes, the number of *bytes* to skip is
		 * a function of the current *bit* length.)
		 */
		int skip_bytes =  state->bits -
		    (state->bytes_in_section % state->bits);
		skip_bytes %= state->bits;
		state->bits_avail = 0; /* Discard rest of this byte. */
		while (skip_bytes-- > 0) {
			code = getbits(self, 8);
			if (code < 0)
				return (code);
		}
		/* Now, actually do the reset. */
		state->bytes_in_section = 0;
		state->bits = 9;
		state->section_end_code = (1 << state->bits) - 1;
		state->free_ent = 257;
		state->oldcode = -1;
		return (next_code(self));
	}

	if (code > state->free_ent
	    || (code == state->free_ent && state->oldcode < 0)) {
		/* An invalid code is a fatal error. */
		archive_set_error(&(self->archive->archive), -1,
		    "Invalid compressed data");
		return (ARCHIVE_FATAL);
	}

	/* Special case for KwKwK string. */
	if (code >= state->free_ent) {
		*state->stackp++ = state->finbyte;
		code = state->oldcode;
	}

	/* Generate output characters in reverse order. */
	while (code >= 256) {
		*state->stackp++ = state->suffix[code];
		code = state->prefix[code];
	}
	*state->stackp++ = state->finbyte = code;

	/* Generate the new entry. */
	code = state->free_ent;
	if (code < state->maxcode && state->oldcode >= 0) {
		state->prefix[code] = state->oldcode;
		state->suffix[code] = state->finbyte;
		++state->free_ent;
	}
	if (state->free_ent > state->section_end_code) {
		state->bits++;
		state->bytes_in_section = 0;
		if (state->bits == state->maxcode_bits)
			state->section_end_code = state->maxcode;
		else
			state->section_end_code = (1 << state->bits) - 1;
	}

	/* Remember previous code. */
	state->oldcode = newcode;
	return (ARCHIVE_OK);
}